

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

EGLConfig eglu::chooseSingleConfig(Library *egl,EGLDisplay display,FilterList *filters)

{
  void *pvVar1;
  bool bVar2;
  reference ppvVar3;
  NotSupportedError *this;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_48;
  __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_> local_40;
  const_iterator cfg;
  vector<void_*,_std::allocator<void_*>_> allConfigs;
  FilterList *filters_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  getConfigs((vector<void_*,_std::allocator<void_*>_> *)&cfg,egl,display);
  local_40._M_current =
       (void **)std::vector<void_*,_std::allocator<void_*>_>::begin
                          ((vector<void_*,_std::allocator<void_*>_> *)&cfg);
  while( true ) {
    local_48._M_current =
         (void **)std::vector<void_*,_std::allocator<void_*>_>::end
                            ((vector<void_*,_std::allocator<void_*>_> *)&cfg);
    bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar2) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"No matching EGL config found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                 ,0x99);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
      ;
    }
    ppvVar3 = __gnu_cxx::
              __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&local_40);
    bVar2 = FilterList::match(filters,egl,display,*ppvVar3);
    if (bVar2) break;
    __gnu_cxx::__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
    operator++(&local_40);
  }
  ppvVar3 = __gnu_cxx::
            __normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>::
            operator*(&local_40);
  pvVar1 = *ppvVar3;
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)&cfg);
  return pvVar1;
}

Assistant:

EGLConfig chooseSingleConfig (const Library& egl, EGLDisplay display, const FilterList& filters)
{
	const vector<EGLConfig>	allConfigs	(getConfigs(egl, display));

	for (vector<EGLConfig>::const_iterator cfg = allConfigs.begin(); cfg != allConfigs.end(); ++cfg)
	{
		if (filters.match(egl, display, *cfg))
			return *cfg;
	}

	TCU_THROW(NotSupportedError, "No matching EGL config found");
}